

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986HierPart(xmlURIPtr uri,char **str)

{
  int iVar1;
  char *pcStack_28;
  int ret;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  pcStack_28 = *str;
  cur = (char *)str;
  str_local = &uri->scheme;
  if ((*pcStack_28 == '/') && (pcStack_28[1] == '/')) {
    pcStack_28 = pcStack_28 + 2;
    iVar1 = xmlParse3986Authority(uri,&stack0xffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (str_local[3] == (char *)0x0) {
      *(undefined4 *)(str_local + 5) = 0xffffffff;
    }
    iVar1 = xmlParse3986PathAbEmpty((xmlURIPtr)str_local,&stack0xffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    *(char **)cur = pcStack_28;
    return 0;
  }
  if (*pcStack_28 == '/') {
    iVar1 = xmlParse3986PathAbsolute(uri,&stack0xffffffffffffffd8);
  }
  else {
    if (((((((*pcStack_28 < 'a') || ('z' < *pcStack_28)) &&
           ((*pcStack_28 < 'A' || ('Z' < *pcStack_28)))) &&
          (((*pcStack_28 < '0' || ('9' < *pcStack_28)) && (*pcStack_28 != '-')))) &&
         (((*pcStack_28 != '.' && (*pcStack_28 != '_')) && (*pcStack_28 != '~')))) &&
        (((*pcStack_28 != '%' ||
          ((((pcStack_28[1] < '0' || ('9' < pcStack_28[1])) &&
            ((pcStack_28[1] < 'a' || ('f' < pcStack_28[1])))) &&
           ((pcStack_28[1] < 'A' || ('F' < pcStack_28[1])))))) ||
         (((pcStack_28[2] < '0' || ('9' < pcStack_28[2])) &&
          (((pcStack_28[2] < 'a' || ('f' < pcStack_28[2])) &&
           ((pcStack_28[2] < 'A' || ('F' < pcStack_28[2])))))))))) &&
       ((((((*pcStack_28 != '!' && (*pcStack_28 != '$')) && (*pcStack_28 != '&')) &&
          ((*pcStack_28 != '(' && (*pcStack_28 != ')')))) && (*pcStack_28 != '*')) &&
        (((*pcStack_28 != '+' && (*pcStack_28 != ',')) &&
         ((*pcStack_28 != ';' &&
          ((((*pcStack_28 != '=' && (*pcStack_28 != '\'')) && (*pcStack_28 != ':')) &&
           (*pcStack_28 != '@')))))))))) {
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
        }
        str_local[6] = (char *)0x0;
      }
      goto LAB_001d63db;
    }
    iVar1 = xmlParse3986PathRootless(uri,&stack0xffffffffffffffd8);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_001d63db:
  *(char **)cur = pcStack_28;
  return 0;
}

Assistant:

static int
xmlParse3986HierPart(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    if ((*cur == '/') && (*(cur + 1) == '/')) {
        cur += 2;
	ret = xmlParse3986Authority(uri, &cur);
	if (ret != 0) return(ret);
	if (uri->server == NULL)
	    uri->port = -1;
	ret = xmlParse3986PathAbEmpty(uri, &cur);
	if (ret != 0) return(ret);
	*str = cur;
	return(0);
    } else if (*cur == '/') {
        ret = xmlParse3986PathAbsolute(uri, &cur);
	if (ret != 0) return(ret);
    } else if (ISA_PCHAR(cur)) {
        ret = xmlParse3986PathRootless(uri, &cur);
	if (ret != 0) return(ret);
    } else {
	/* path-empty is effectively empty */
	if (uri != NULL) {
	    if (uri->path != NULL) xmlFree(uri->path);
	    uri->path = NULL;
	}
    }
    *str = cur;
    return (0);
}